

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
parse_format_string<false,wchar_t,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
          *handler)

{
  internal *end;
  internal *begin;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  *this_00;
  internal *end_00;
  char *message;
  writer write;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_&,_wchar_t>
  local_40;
  writer local_38;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
             *)format_str.size_;
  end = this + (long)format_str.data_ * 4;
  local_38.handler_ = this_00;
  do {
    if (this == end) {
      return;
    }
    end_00 = this;
    if (*(int *)this != 0x7b) {
      while( true ) {
        if (end_00 == end) {
          parse_format_string<false,_wchar_t,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_&>
          ::writer::operator()(&local_38,(wchar_t *)this,(wchar_t *)end);
          return;
        }
        if (*(wchar_t *)end_00 == L'{') break;
        end_00 = end_00 + 4;
      }
    }
    parse_format_string<false,_wchar_t,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>_&>
    ::writer::operator()(&local_38,(wchar_t *)this,(wchar_t *)end_00);
    begin = end_00 + 4;
    if (begin == end) {
      message = "invalid format string";
      goto LAB_001b6933;
    }
    if ((char)*(wchar_t *)begin == '}') {
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
      ::on_arg_id(this_00);
LAB_001b6870:
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
      ::on_replacement_field(this_00,(wchar_t *)begin);
    }
    else {
      if (*(wchar_t *)begin != L'{') {
        local_40.handler = this_00;
        begin = (internal *)
                parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>&,wchar_t>>
                          ((wchar_t *)begin,(wchar_t *)end,&local_40);
        if (begin != end) {
          if (*(wchar_t *)begin == L':') {
            begin = (internal *)
                    format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                    ::on_format_specs(this_00,(wchar_t *)(begin + 4),(wchar_t *)end);
            if ((begin == end) || (*(wchar_t *)begin != L'}')) {
              message = "unknown format specifier";
              goto LAB_001b6933;
            }
            goto LAB_001b68f2;
          }
          if (*(wchar_t *)begin == L'}') goto LAB_001b6870;
        }
        message = "missing \'}\' in format string";
LAB_001b6933:
        error_handler::on_error((error_handler *)this_00,message);
        return;
      }
      format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
      ::on_text(this_00,(wchar_t *)begin,(wchar_t *)(end_00 + 8));
    }
LAB_001b68f2:
    this = begin + 4;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}